

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

bool google::protobuf::internal::VerifyUTF8(StringPiece str,char *field_name)

{
  bool bVar1;
  byte bVar2;
  bool in_stack_000000a7;
  char *in_stack_000000a8;
  char *in_stack_000000b0;
  StringPiece *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  string local_40 [63];
  bool local_1;
  
  StringPiece::operator_cast_to_string(in_stack_ffffffffffffff98);
  bVar1 = IsStructurallyValidUTF8
                    ((string *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  bVar2 = bVar1 ^ 0xff;
  std::__cxx11::string::~string(local_40);
  local_1 = (bVar2 & 1) != 0;
  if (local_1) {
    PrintUTF8ErrorLog(in_stack_000000b0,in_stack_000000a8,in_stack_000000a7);
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

bool VerifyUTF8(StringPiece str, const char* field_name) {
  if (!IsStructurallyValidUTF8(str)) {
    PrintUTF8ErrorLog(field_name, "parsing", false);
    return false;
  }
  return true;
}